

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O3

bool adiak::value<int>(string *name,int value,int category,string *subcategory)

{
  int iVar1;
  adiak_datatype_t *type;
  adiak_value_t *value_00;
  bool bVar2;
  
  type = adiak_get_basetype(adiak_int);
  if (type == (adiak_datatype_t *)0x0) {
    bVar2 = false;
  }
  else {
    value_00 = (adiak_value_t *)malloc(8);
    value_00->v_int = value;
    iVar1 = adiak_raw_namevalue((name->_M_dataplus)._M_p,category,(subcategory->_M_dataplus)._M_p,
                                value_00,type);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }